

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::realTime_rawOPL(MIDIplay *this,uint8_t reg,uint8_t value)

{
  OPL3 *this_00;
  Synth *synth;
  uint8_t value_local;
  uint8_t reg_local;
  MIDIplay *this_local;
  
  this_00 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*(&this->m_synth);
  synth._6_1_ = value;
  if ((reg & 0xf0) == 0xc0) {
    synth._6_1_ = value | 0x30;
  }
  ::OPL3::writeReg(this_00,0,(ushort)reg,synth._6_1_);
  return;
}

Assistant:

void MIDIplay::realTime_rawOPL(uint8_t reg, uint8_t value)
{
    Synth &synth = *m_synth;
    if((reg & 0xF0) == 0xC0)
        value |= 0x30;
    //std::printf("OPL poke %02X, %02X\n", reg, value);
    //std::fflush(stdout);
    synth.writeReg(0, reg, value);
}